

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setControlWeight
          (L2NormCost *this,VectorDynSize *controlWeights)

{
  bool bVar1;
  long in_RDI;
  VectorDynSize *in_stack_00000190;
  CostAttributes *in_stack_00000198;
  bool local_1;
  
  bVar1 = CostAttributes::isValid((CostAttributes *)(*(long *)(in_RDI + 0x28) + 0x128));
  if (bVar1) {
    bVar1 = CostAttributes::setWeightMatrix(in_stack_00000198,in_stack_00000190);
    if (bVar1) {
      local_1 = true;
    }
    else {
      iDynTree::reportError
                ("L2NormCost","setControlWeight","Error when specifying the control weights.");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("L2NormCost","setControlWeight",
               "The control cost portion has been deactivated, given the provided selectors.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool L2NormCost::setControlWeight(const VectorDynSize &controlWeights)
        {
            if (!(m_pimpl->controlCost.isValid())) {
                reportError("L2NormCost", "setControlWeight", "The control cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!(m_pimpl->controlCost.setWeightMatrix(controlWeights))) {
                reportError("L2NormCost", "setControlWeight", "Error when specifying the control weights.");
                return false;
            }

            return true;
        }